

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O2

void Of_ManCreateSat(Of_Man_t *p,int nCutsAll,Vec_Int_t *vFirst,Vec_Int_t *vCutNum,
                    Vec_Int_t *vBestNode,Vec_Int_t *vBestCut)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Vec_Int_t *pVVar7;
  sat_solver *s;
  Gia_Obj_t *pGVar8;
  abctime aVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  abctime time;
  abctime time_00;
  uint uVar13;
  int i;
  char *pStr;
  Gia_Man_t *p_00;
  char *__format;
  int *piVar14;
  bool bVar15;
  int pLits [2];
  int Lit;
  Vec_Int_t *local_70;
  Vec_Int_t *local_68;
  Vec_Int_t *local_60;
  int local_54;
  abctime local_50;
  ulong local_48;
  Vec_Int_t *local_40;
  Gia_Obj_t *local_38;
  
  local_68 = vFirst;
  local_60 = vCutNum;
  pVVar7 = Vec_IntAlloc(100);
  local_50 = Abc_Clock();
  s = sat_solver_new();
  iVar2 = Gia_ManAndNum(p->pGia);
  local_48 = (ulong)(uint)nCutsAll;
  sat_solver_setnvars(s,iVar2 + nCutsAll);
  for (iVar2 = 0; iVar2 < vBestCut->nSize; iVar2 = iVar2 + 1) {
    iVar3 = Vec_IntEntry(vBestCut,iVar2);
    Vec_IntPush(vBestNode,iVar3);
  }
  piVar14 = vBestNode->pArray;
  uVar13 = vBestNode->nSize;
  for (lVar11 = 0; lVar11 < s->size; lVar11 = lVar11 + 1) {
    s->polarity[lVar11] = '\0';
  }
  uVar12 = 0;
  uVar10 = (ulong)uVar13;
  if ((int)uVar13 < 1) {
    uVar10 = uVar12;
  }
  for (; uVar10 != uVar12; uVar12 = uVar12 + 1) {
    s->polarity[piVar14[uVar12]] = '\x01';
  }
  local_70 = pVVar7;
  if (vBestCut->nSize < 0) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  vBestNode->nSize = vBestNode->nSize - vBestCut->nSize;
  iVar2 = 0;
  local_40 = vBestNode;
  while ((iVar2 < p->pGia->nObjs && (pGVar8 = Gia_ManObj(p->pGia,iVar2), pGVar8 != (Gia_Obj_t *)0x0)
         )) {
    if ((~*(uint *)pGVar8 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar8) {
      iVar3 = Vec_IntEntry(local_68,iVar2);
      iVar4 = Vec_IntEntry(local_60,iVar2);
      pVVar7 = local_70;
      local_70->nSize = 0;
      iVar5 = Abc_Var2Lit(pGVar8->Value,1);
      Vec_IntPush(pVVar7,iVar5);
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      while (bVar15 = iVar4 != 0, iVar4 = iVar4 + -1, bVar15) {
        iVar5 = Abc_Var2Lit(iVar3,0);
        Vec_IntPush(pVVar7,iVar5);
        iVar3 = iVar3 + 1;
      }
      iVar3 = sat_solver_addclause(s,pVVar7->pArray,pVVar7->pArray + pVVar7->nSize);
      if (iVar3 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                      ,0x606,
                      "void Of_ManCreateSat(Of_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
    }
    iVar2 = iVar2 + 1;
  }
  pVVar7 = (Vec_Int_t *)0x0;
  iVar2 = 0;
  while ((iVar2 < p->pGia->nObjs && (pGVar8 = Gia_ManObj(p->pGia,iVar2), pGVar8 != (Gia_Obj_t *)0x0)
         )) {
    if ((~*(uint *)pGVar8 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar8) {
      local_54 = iVar2;
      local_38 = pGVar8;
      local_68 = (Vec_Int_t *)Of_ObjCutSet(p,iVar2);
      piVar14 = &local_68->nSize;
      for (iVar3 = 0; iVar2 = local_54, iVar3 < local_68->nCap; iVar3 = iVar3 + 1) {
        iVar2 = Gia_ManAndNum(p->pGia);
        pLits[0] = Abc_Var2Lit(iVar2 + (int)pVVar7,1);
        pLits[1] = Abc_Var2Lit(local_38->Value,0);
        iVar2 = sat_solver_addclause(s,pLits,&Lit);
        if (iVar2 == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                        ,0x613,
                        "void Of_ManCreateSat(Of_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        local_60 = pVVar7;
        for (uVar13 = 0; uVar6 = *piVar14 & 0x1f, uVar13 < uVar6; uVar13 = uVar13 + 1) {
          iVar2 = Of_CutVar(piVar14,uVar13);
          if (iVar2 == 0) {
            uVar6 = *piVar14 & 0x1f;
            break;
          }
          pGVar8 = Gia_ManObj(p->pGia,iVar2);
          if ((~*(uint *)pGVar8 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar8) {
            pLits[1] = Abc_Var2Lit(pGVar8->Value,0);
            iVar2 = sat_solver_addclause(s,pLits,&Lit);
            if (iVar2 == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                            ,0x61b,
                            "void Of_ManCreateSat(Of_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                           );
            }
          }
        }
        pVVar7 = (Vec_Int_t *)(ulong)((int)local_60 + 1);
        piVar14 = piVar14 + (ulong)uVar6 + 4;
      }
    }
    iVar2 = iVar2 + 1;
  }
  if ((int)pVVar7 != (int)local_48) {
    __assert_fail("nCutCount == nCutsAll",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                  ,0x620,
                  "void Of_ManCreateSat(Of_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  iVar2 = 0;
  while ((iVar2 < p->pGia->vCos->nSize &&
         (pGVar8 = Gia_ManCo(p->pGia,iVar2), pGVar8 != (Gia_Obj_t *)0x0))) {
    *(ulong *)(pGVar8 + -(ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff)) =
         *(ulong *)(pGVar8 + -(ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff)) | 0x40000000;
    iVar2 = iVar2 + 1;
  }
  iVar2 = 0;
  while ((iVar2 < p->pGia->nObjs && (pGVar8 = Gia_ManObj(p->pGia,iVar2), pGVar8 != (Gia_Obj_t *)0x0)
         )) {
    if ((*(uint *)pGVar8 & 0xc0000000) == 0x40000000 && (~*(uint *)pGVar8 & 0x1fffffff) != 0) {
      Lit = Abc_Var2Lit(pGVar8->Value,0);
      iVar3 = sat_solver_addclause(s,&Lit,(lit *)&local_70);
      if (iVar3 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                      ,0x62b,
                      "void Of_ManCreateSat(Of_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
    }
    iVar2 = iVar2 + 1;
  }
  pVVar1 = local_40;
  pVVar7 = local_70;
  for (iVar2 = 0; p_00 = p->pGia, iVar2 < p_00->vCos->nSize; iVar2 = iVar2 + 1) {
    pGVar8 = Gia_ManCo(p_00,iVar2);
    if (pGVar8 == (Gia_Obj_t *)0x0) {
      p_00 = p->pGia;
      break;
    }
    *(ulong *)(pGVar8 + -(ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff)) =
         *(ulong *)(pGVar8 + -(ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff)) &
         0xffffffffbfffffff;
  }
  uVar13 = (s->stats).clauses;
  pVVar7->nSize = 0;
  uVar6 = Gia_ManAndNum(p_00);
  Vec_IntGrow(pVVar7,uVar6);
  uVar12 = 0;
  uVar10 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar10 = uVar12;
  }
  for (; uVar10 != uVar12; uVar12 = uVar12 + 1) {
    pVVar7->pArray[uVar12] = (int)uVar12;
  }
  pVVar7->nSize = uVar6;
  Cnf_AddCardinConstrPairWise(s,pVVar7,pVVar1->nSize + -2,0);
  printf("Problem clauses = %d.  Cardinality clauses = %d.\n",(ulong)uVar13,
         (ulong)((s->stats).clauses - uVar13));
  pStr = (char *)0x0;
  iVar2 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,1000000,0,0,0);
  if (iVar2 == -1) {
    __format = "Unsatisfiable. ";
LAB_0060d6af:
    printf(__format);
  }
  else {
    if (iVar2 == 0) {
      __format = "Undecided.  ";
      goto LAB_0060d6af;
    }
    if (iVar2 == 1) {
      printf("Satisfiable.  ");
      aVar9 = Abc_Clock();
      Abc_PrintTime((int)aVar9 - (int)local_50,pStr,time);
      Sat_SolverPrintStats(_stdout,s);
      uVar13 = 0;
      for (iVar2 = 0; iVar3 = Gia_ManAndNum(p->pGia), iVar2 < iVar3; iVar2 = iVar2 + 1) {
        uVar6 = sat_solver_var_value(s,iVar2);
        printf("%d",(ulong)uVar6);
        iVar3 = sat_solver_var_value(s,iVar2);
        uVar13 = uVar13 + iVar3;
      }
      printf(" Nodes = %d\n",(ulong)uVar13);
      uVar13 = 0;
      while( true ) {
        iVar3 = Gia_ManAndNum(p->pGia);
        if (iVar3 + (int)local_48 <= iVar2) break;
        uVar6 = sat_solver_var_value(s,iVar2);
        printf("%d",(ulong)uVar6);
        iVar3 = sat_solver_var_value(s,iVar2);
        uVar13 = uVar13 + iVar3;
        iVar2 = iVar2 + 1;
      }
      printf(" LUTs = %d\n",(ulong)uVar13);
      pVVar7 = local_70;
      goto LAB_0060d741;
    }
  }
  aVar9 = Abc_Clock();
  Abc_PrintTime((int)aVar9 - (int)local_50,pStr,time_00);
  Sat_SolverPrintStats(_stdout,s);
LAB_0060d741:
  sat_solver_delete(s);
  Vec_IntFree(pVVar7);
  return;
}

Assistant:

void Of_ManCreateSat( Of_Man_t * p, int nCutsAll, Vec_Int_t * vFirst, Vec_Int_t * vCutNum, Vec_Int_t * vBestNode, Vec_Int_t * vBestCut )
{
    extern void Cnf_AddCardinConstrPairWise( sat_solver * p, Vec_Int_t * vVars, int K, int fStrict );

    Gia_Obj_t * pObj, * pVar;
    int * pCutSet, * pCut;
    int i, k, v, c, Var, Lit, pLits[2], status, RetValue, nCutCount, nClauses;
    Vec_Int_t * vLits = Vec_IntAlloc( 100 );
    abctime clk = Abc_Clock();

    // start solver
    sat_solver * pSat = sat_solver_new();
    sat_solver_setnvars( pSat, Gia_ManAndNum(p->pGia) + nCutsAll );

    // set polarity
    Vec_IntAppend( vBestNode, vBestCut );
    //Vec_IntPrint( vBestNode );
    sat_solver_set_polarity( pSat, Vec_IntArray(vBestNode), Vec_IntSize(vBestNode) );
    Vec_IntShrink( vBestNode, Vec_IntSize(vBestNode) - Vec_IntSize(vBestCut) );

    // add clauses for nodes
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        int iFirst = Vec_IntEntry(vFirst, i);
        int nCuts = Vec_IntEntry(vCutNum, i);
        Vec_IntClear( vLits );
        Vec_IntPush( vLits, Abc_Var2Lit(pObj->Value, 1) );
        for ( c = 0; c < nCuts; c++ )
            Vec_IntPush( vLits, Abc_Var2Lit(iFirst + c, 0) );
        RetValue = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits) );
        assert( RetValue );
    }

    // add clauses for cuts
    nCutCount = 0;
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        pCutSet = Of_ObjCutSet(p, i);
        Of_SetForEachCut( pCutSet, pCut, k )
        {
            pLits[0] = Abc_Var2Lit( Gia_ManAndNum(p->pGia) + nCutCount, 1 );
            pLits[1] = Abc_Var2Lit( pObj->Value, 0 );
            RetValue = sat_solver_addclause( pSat, pLits, pLits+2 );
            assert( RetValue );
            Of_CutForEachVar( pCut, Var, v )
            {
                pVar = Gia_ManObj(p->pGia, Var);
                if ( !Gia_ObjIsAnd(pVar) )
                    continue;
                pLits[1] = Abc_Var2Lit( pVar->Value, 0 );
                RetValue = sat_solver_addclause( pSat, pLits, pLits+2 );
                assert( RetValue );
            }
            nCutCount++;
        }
    }
    assert( nCutCount == nCutsAll );

    // mark CO drivers
    Gia_ManForEachCo( p->pGia, pObj, i )
        Gia_ObjFanin0(pObj)->fMark0 = 1;
    // set used nodes to 1
    Gia_ManForEachAnd( p->pGia, pObj, i )
        if ( pObj->fMark0 )
        {
            Lit = Abc_Var2Lit( pObj->Value, 0 );
            RetValue = sat_solver_addclause( pSat, &Lit, &Lit + 1 );
            assert( RetValue );
        }
    // unmark CO drivers
    Gia_ManForEachCo( p->pGia, pObj, i )
        Gia_ObjFanin0(pObj)->fMark0 = 0;

//    Sat_SolverWriteDimacs( pSat, "temp.cnf", NULL, NULL, 0 );

    // add cardinality constraint
    nClauses = pSat->stats.clauses;
    Vec_IntClear( vLits );
    Vec_IntFillNatural( vLits, Gia_ManAndNum(p->pGia) );
    Cnf_AddCardinConstrPairWise( pSat, vLits, Vec_IntSize(vBestNode)-2, 0 );
    printf( "Problem clauses = %d.  Cardinality clauses = %d.\n", nClauses, pSat->stats.clauses - nClauses );

    // solve the problem
    status = sat_solver_solve( pSat, NULL, NULL, 1000000, 0, 0, 0 );
    if ( status == l_Undef )
        printf( "Undecided.  " );
    if ( status == l_True )
        printf( "Satisfiable.  " );
    if ( status == l_False )
        printf( "Unsatisfiable. " );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Sat_SolverPrintStats( stdout, pSat );
    if ( status == l_True )
    {
        int nOnes = 0;
        for ( v = 0; v < Gia_ManAndNum(p->pGia); v++ )
        {
            printf( "%d", sat_solver_var_value(pSat, v) );
            nOnes += sat_solver_var_value(pSat, v);
        }
        printf( " Nodes = %d\n", nOnes );

        nOnes = 0;
        for ( ; v < Gia_ManAndNum(p->pGia) + nCutsAll; v++ )
        {
            printf( "%d", sat_solver_var_value(pSat, v) );
            nOnes += sat_solver_var_value(pSat, v);
        }
        printf( " LUTs = %d\n", nOnes );
    }

    // cleanup
    sat_solver_delete( pSat );
    Vec_IntFree( vLits );
}